

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall
ObjectTest_basic_value_constructor_Test::TestBody(ObjectTest_basic_value_constructor_Test *this)

{
  longdouble lVar1;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar4;
  undefined1 *puVar5;
  Message MVar6;
  undefined1 uVar7;
  undefined2 uVar8;
  undefined4 uVar9;
  AssertHelper AVar10;
  undefined1 uVar11;
  undefined2 uVar12;
  undefined4 uVar13;
  char *pcVar14;
  pointer *__ptr;
  pointer *__ptr_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_11;
  object test_object__;
  undefined1 local_e8 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_d8;
  undefined1 local_c8 [8];
  undefined2 uStack_c0;
  undefined6 uStack_be;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_b8;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_a8;
  internal local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_78;
  char local_48;
  
  local_78._M_rest._0_1_ = (undefined1)false;
  local_48 = 1;
  local_c8[0] = (Message)0x0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_e8,"test_object__.get< bool >()","bool {}",(bool *)local_c8,
             (bool *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (_Stack_e0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)_Stack_e0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x157,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar2 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )_Stack_e0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_e0,_Stack_e0._M_head_impl);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  testing::internal::CmpHelperEQ<signed_char,signed_char>
            ((internal *)local_e8,"test_object__.get< signed_char_t >()","signed_char_t {}",local_c8
             ,(char *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Stack_e0._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)_Stack_e0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x158,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar2 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if (_Stack_e0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_e0,_Stack_e0._M_head_impl);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)local_e8,"test_object__.get< unsigned_char_t >()","unsigned_char_t {}",
             local_c8,(uchar *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (_Stack_e0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)_Stack_e0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x159,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar2 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )_Stack_e0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_e0,_Stack_e0._M_head_impl);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  testing::internal::CmpHelperEQ<short,short>
            ((internal *)local_e8,"test_object__.get< short >()","short {}",(short *)local_c8,
             (short *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Stack_e0._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)_Stack_e0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15a,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar2 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if (_Stack_e0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_e0,_Stack_e0._M_head_impl);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"test_object__.get< int >()","int {}",(int *)local_c8,
             (int *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (_Stack_e0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)_Stack_e0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15b,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar2 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )_Stack_e0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_e0,_Stack_e0._M_head_impl);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_c8._4_4_ = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  local_a8._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_e8,"test_object__.get< long >()","long {}",(long *)local_c8,
             (long *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Stack_e0._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)_Stack_e0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15c,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar2 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if (_Stack_e0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_e0,_Stack_e0._M_head_impl);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_c8._4_4_ = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  local_a8._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<long_long,long_long>
            ((internal *)local_e8,"test_object__.get< long_long_t >()","long_long_t {}",
             (longlong *)local_c8,(longlong *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (_Stack_e0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)_Stack_e0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15d,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar2 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )_Stack_e0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_e0,_Stack_e0._M_head_impl);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_c8._4_4_ = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  local_a8._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_e8,"test_object__.get< intmax_t >()","intmax_t {}",(long *)local_c8,
             (long *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Stack_e0._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)_Stack_e0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15e,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar2 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if (_Stack_e0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_e0,_Stack_e0._M_head_impl);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  lVar1 = (longdouble)0;
  local_78._M_rest._M_first._M_storage = SUB101(lVar1,0);
  local_78._1_7_ = (undefined7)((unkuint10)lVar1 >> 8);
  local_78._8_2_ = (undefined2)((unkuint10)lVar1 >> 0x40);
  local_48 = 3;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_e8,"test_object__.get< float >()","float {}",(float *)local_c8,
             (float *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (_Stack_e0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)_Stack_e0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15f,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar2 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )_Stack_e0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_e0,_Stack_e0._M_head_impl);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  lVar1 = (longdouble)0;
  local_78._M_rest._M_first._M_storage = SUB101(lVar1,0);
  local_78._1_7_ = (undefined7)((unkuint10)lVar1 >> 8);
  local_78._8_2_ = (undefined2)((unkuint10)lVar1 >> 0x40);
  local_48 = 3;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_c8._4_4_ = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  local_a8._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_e8,"test_object__.get< double >()","double {}",(double *)local_c8,
             (double *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Stack_e0._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)_Stack_e0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x160,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar2 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if (_Stack_e0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_e0,_Stack_e0._M_head_impl);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  lVar1 = (longdouble)0;
  local_78._M_rest._M_first._M_storage = SUB101(lVar1,0);
  local_78._1_7_ = (undefined7)((unkuint10)lVar1 >> 8);
  local_78._8_2_ = (undefined2)((unkuint10)lVar1 >> 0x40);
  local_48 = 3;
  local_c8[1] = (undefined1)((unkuint10)lVar1 >> 8);
  local_c8._2_2_ = (undefined2)((unkuint10)lVar1 >> 0x10);
  local_c8._4_4_ = (undefined4)((unkuint10)lVar1 >> 0x20);
  local_c8[0] = local_78._M_rest._0_1_;
  uStack_c0 = local_78._8_2_;
  local_a8._M_dataplus._M_p._0_1_ = local_78._M_rest._0_1_;
  local_a8._M_dataplus._M_p._1_1_ = local_c8[1];
  local_a8._M_dataplus._M_p._2_2_ = local_c8._2_2_;
  local_a8._M_dataplus._M_p._4_4_ = local_c8._4_4_;
  local_a8._M_string_length._0_2_ = local_78._8_2_;
  testing::internal::CmpHelperEQ<long_double,long_double>
            ((internal *)local_e8,"test_object__.get< long_double_t >()","long_double_t {}",
             (longdouble *)local_c8,(longdouble *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (_Stack_e0._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)_Stack_e0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x161,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar2 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )_Stack_e0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_e0,_Stack_e0._M_head_impl);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_d8._M_local_buf[0] = '\0';
  local_d8._M_allocated_capacity._1_7_ = local_b8._M_allocated_capacity._1_7_;
  local_d8._9_4_ = local_b8._9_4_;
  local_d8._13_2_ = local_b8._13_2_;
  local_d8._M_local_buf[0xf] = local_b8._M_local_buf[0xf];
  _Stack_e0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78._M_rest._M_first._M_storage = SUB81((long)&local_78 + 0x10,0);
  local_78._1_7_ = (undefined7)((ulong)((long)&local_78 + 0x10) >> 8);
  local_78._16_8_ = (ulong)(uint7)local_b8._M_allocated_capacity._1_7_ << 8;
  local_78._8_2_ = 0;
  local_78._10_6_ = 0;
  local_48 = '\x04';
  local_c8[0] = SUB81(&local_b8,0);
  MVar6 = (Message)local_c8[0];
  local_c8[1] = (undefined1)((ulong)&local_b8 >> 8);
  uVar7 = local_c8[1];
  local_c8._2_2_ = (undefined2)((ulong)&local_b8 >> 0x10);
  uVar8 = local_c8._2_2_;
  local_c8._4_4_ = (undefined4)((ulong)&local_b8 >> 0x20);
  uVar9 = local_c8._4_4_;
  uStack_c0 = 0;
  uStack_be = 0;
  local_b8._M_local_buf[0] = '\0';
  local_e8 = (undefined1  [8])&local_d8;
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             (object *)&local_78._M_first,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_c8)
  ;
  paVar4 = &local_a8.field_2;
  local_a8._M_dataplus._M_p._0_1_ = SUB81(paVar4,0);
  AVar10 = (AssertHelper)local_a8._M_dataplus._M_p._0_1_;
  local_a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar4 >> 8);
  uVar11 = local_a8._M_dataplus._M_p._1_1_;
  local_a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar4 >> 0x10);
  uVar12 = local_a8._M_dataplus._M_p._2_2_;
  local_a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar4 >> 0x20);
  uVar13 = local_a8._M_dataplus._M_p._4_4_;
  local_a8._M_string_length._0_2_ = 0;
  local_a8._M_string_length._2_6_ = 0;
  local_a8.field_2._M_allocated_capacity =
       local_a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            (local_88,"test_object__.get< std::u8string >()","std::u8string {}",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             &local_a8);
  puVar5 = (undefined1 *)
           CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                    CONCAT22(local_a8._M_dataplus._M_p._2_2_,
                             CONCAT11(local_a8._M_dataplus._M_p._1_1_,
                                      local_a8._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)puVar5 != paVar4) {
    operator_delete(puVar5,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != (undefined1  [8])&local_d8) {
    operator_delete((void *)local_e8,
                    CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
  }
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_c8._4_4_,CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
  if (paVar3 != &local_b8) {
    operator_delete(paVar3,CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) +
                           1);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x162,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_e8 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_e8 = (undefined1  [8])0x0;
  _Stack_e0._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_d8._M_local_buf[0] = '\0';
  local_d8._M_allocated_capacity._1_7_ = 0;
  jessilib::object::
  object<std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)&local_78._M_first,
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8);
  local_c8[0] = local_48 == '\x06';
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"test_object__ .has< object::array_type >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x163,(char *)local_e8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    if (local_e8 != (undefined1  [8])&local_d8) {
      operator_delete((void *)local_e8,
                      CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
    }
    plVar2 = (long *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                              CONCAT22(local_a8._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_a8._M_dataplus._M_p._1_1_,
                                                local_a8._M_dataplus._M_p._0_1_)));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_be,uStack_c0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_be,uStack_c0));
  }
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_c8._4_4_ = 0;
  uStack_c0 = 0;
  uStack_be = 0;
  local_b8._M_local_buf[0] = '\0';
  local_b8._M_allocated_capacity._1_7_ = 0;
  if (local_48 == '\x06') {
    std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector
              ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8,
               (vector<jessilib::object,_std::allocator<jessilib::object>_> *)&local_78._M_first);
  }
  else {
    local_e8 = (undefined1  [8])0x0;
    _Stack_e0._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_d8._M_local_buf[0] = '\0';
    local_d8._M_allocated_capacity._1_7_ = 0;
    local_c8[0] = (Message)0x0;
    local_c8[1] = 0;
    local_c8._2_2_ = 0;
    local_c8._4_4_ = 0;
    uStack_c0 = 0;
    uStack_be = 0;
    local_b8._M_local_buf[0] = '\0';
    local_b8._M_allocated_capacity._1_7_ = 0;
  }
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  local_a8._M_dataplus._M_p._4_4_ = 0;
  local_a8._M_string_length._0_2_ = 0;
  local_a8._M_string_length._2_6_ = 0;
  local_a8.field_2._M_allocated_capacity = 0;
  testing::internal::
  CmpHelperEQ<std::vector<jessilib::object,std::allocator<jessilib::object>>,std::vector<jessilib::object,std::allocator<jessilib::object>>>
            (local_88,"test_object__.get< object::array_type >()","object::array_type {}",
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8,
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)&local_a8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)&local_a8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_c8);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x163,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_e8 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  pcVar14 = "";
  jessilib::object::object((object *)&local_78._M_first,"");
  local_c8[0] = local_48 == '\x04';
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj.has<std::u8string>()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x168,(char *)local_e8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    if (local_e8 != (undefined1  [8])&local_d8) {
      operator_delete((void *)local_e8,
                      CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
    }
    plVar2 = (long *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                              CONCAT22(local_a8._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_a8._M_dataplus._M_p._1_1_,
                                                local_a8._M_dataplus._M_p._0_1_)));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_be,uStack_c0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_be,uStack_c0));
  }
  uStack_c0 = 0;
  uStack_be = 0;
  local_b8._M_local_buf[0] = '\0';
  local_c8[0] = MVar6;
  local_c8[1] = uVar7;
  local_c8._2_2_ = uVar8;
  local_c8._4_4_ = uVar9;
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             (object *)&local_78._M_first,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_c8)
  ;
  local_a8._M_string_length._0_2_ = 0;
  local_a8._M_string_length._2_6_ = 0;
  local_a8.field_2._M_allocated_capacity =
       local_a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_a8._M_dataplus._M_p._0_1_ = AVar10;
  local_a8._M_dataplus._M_p._1_1_ = uVar11;
  local_a8._M_dataplus._M_p._2_2_ = uVar12;
  local_a8._M_dataplus._M_p._4_4_ = uVar13;
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            (local_88,"obj.get<std::u8string>()","std::u8string{}",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             &local_a8);
  puVar5 = (undefined1 *)
           CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                    CONCAT22(local_a8._M_dataplus._M_p._2_2_,
                             CONCAT11(local_a8._M_dataplus._M_p._1_1_,
                                      local_a8._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)puVar5 != paVar4) {
    operator_delete(puVar5,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != (undefined1  [8])&local_d8) {
    operator_delete((void *)local_e8,
                    CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
  }
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_c8._4_4_,CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
  if (paVar3 != &local_b8) {
    operator_delete(paVar3,CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) +
                           1);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x169,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_e8 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_e8 = (undefined1  [8])0x0;
  pcVar14 = "";
  _Stack_e0._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)"\a" + 1);
  jessilib::object::object((object *)&local_78._M_first,local_e8);
  local_c8[0] = local_48 == '\x04';
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj.has<std::u8string>()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x16f,(char *)local_e8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    if (local_e8 != (undefined1  [8])&local_d8) {
      operator_delete((void *)local_e8,
                      CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
    }
    plVar2 = (long *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                              CONCAT22(local_a8._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_a8._M_dataplus._M_p._1_1_,
                                                local_a8._M_dataplus._M_p._0_1_)));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_be,uStack_c0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_be,uStack_c0));
  }
  uStack_c0 = 0;
  uStack_be = 0;
  local_b8._M_local_buf[0] = '\0';
  local_c8[0] = MVar6;
  local_c8[1] = uVar7;
  local_c8._2_2_ = uVar8;
  local_c8._4_4_ = uVar9;
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             (object *)&local_78._M_first,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_c8)
  ;
  local_a8._M_string_length._0_2_ = 0;
  local_a8._M_string_length._2_6_ = 0;
  local_a8.field_2._M_allocated_capacity =
       local_a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_a8._M_dataplus._M_p._0_1_ = AVar10;
  local_a8._M_dataplus._M_p._1_1_ = uVar11;
  local_a8._M_dataplus._M_p._2_2_ = uVar12;
  local_a8._M_dataplus._M_p._4_4_ = uVar13;
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            (local_88,"obj.get<std::u8string>()","std::u8string{}",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             &local_a8);
  puVar5 = (undefined1 *)
           CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                    CONCAT22(local_a8._M_dataplus._M_p._2_2_,
                             CONCAT11(local_a8._M_dataplus._M_p._1_1_,
                                      local_a8._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)puVar5 != paVar4) {
    operator_delete(puVar5,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != (undefined1  [8])&local_d8) {
    operator_delete((void *)local_e8,
                    CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
  }
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_c8._4_4_,CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
  if (paVar4 != &local_b8) {
    operator_delete(paVar4,CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) +
                           1);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x170,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_e8 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  return;
}

Assistant:

TEST(ObjectTest, basic_value_constructor) {
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(bool);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(signed_char_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(unsigned_char_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(short);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(int);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(long);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(long_long_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(intmax_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(float);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(double);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(long_double_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::u8string);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(object::array_type);

	// const char*
	{
		object obj{ u8"" };
		EXPECT_TRUE(obj.has<std::u8string>());
		EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
	}

	// std::u8string_view
	{
		object obj{ u8""sv };
		EXPECT_TRUE(obj.has<std::u8string>());
		EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
	}
}